

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O2

V2x64U __thiscall
highwayhash::SSE41::HHStateSSE41::LoadMultipleOfFour(HHStateSSE41 *this,char *bytes,size_t size)

{
  undefined4 uVar1;
  V2x64U *ret;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  V2x64U VVar5;
  
  auVar2 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this->v0L).v_ = (undefined1  [16])0x0;
  if ((size & 8) == 0) {
    auVar3 = ZEXT416(0xffffffff);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)bytes;
    *(undefined1 (*) [16])(this->v0L).v_ = auVar2;
    bytes = bytes + 8;
    auVar3 = pmovsxbd(in_XMM1,0xff0000);
  }
  if ((size & 4) != 0) {
    uVar1 = *(undefined4 *)bytes;
    auVar4._4_4_ = uVar1;
    auVar4._0_4_ = uVar1;
    auVar4._8_4_ = uVar1;
    auVar4._12_4_ = uVar1;
    *(undefined1 (*) [16])(this->v0L).v_ = auVar3 & auVar4 | auVar2;
  }
  VVar5.v_[1] = size;
  VVar5.v_[0] = (longlong)this;
  return (V2x64U)VVar5.v_;
}

Assistant:

static HH_INLINE V2x64U LoadMultipleOfFour(const char* bytes,
                                             const size_t size) {
    const uint32_t* words = reinterpret_cast<const uint32_t*>(bytes);
    // Mask of 1-bits where the final 4 bytes should be inserted (replacement
    // for variable shift/insert using broadcast+blend).
    V2x64U mask4(_mm_cvtsi64_si128(0xFFFFFFFFULL));  // 'insert' into lane 0
    V2x64U ret(0);
    if (size & 8) {
      ret = V2x64U(_mm_loadl_epi64(reinterpret_cast<const __m128i*>(words)));
      // mask4 = 0 ~0 0 0 ('insert' into lane 2)
      mask4 = V2x64U(_mm_slli_si128(mask4, 8));
      words += 2;
    }
    // Final 4 (possibly after the 8 above); 'insert' into lane 0 or 2 of ret.
    if (size & 4) {
      const __m128i word2 = _mm_cvtsi32_si128(LoadUnaligned<uint32_t>(words));
      // = 0 word2 0 word2; mask4 will select which lane to keep.
      const V2x64U broadcast(_mm_shuffle_epi32(word2, 0x00));
      // (slightly faster than blendv_epi8)
      ret |= V2x64U(broadcast & mask4);
    }
    return ret;
  }